

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool duckdb_snappy::Uncompress(char *compressed,size_t compressed_length,string *uncompressed)

{
  bool bVar1;
  char *pcVar2;
  char *in_RDX;
  size_t in_RSI;
  string *in_RDI;
  size_t ulength;
  size_t in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  size_t *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  bVar1 = GetUncompressedLength
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::max_size();
    if (pcVar2 < in_stack_ffffffffffffffd8) {
      local_1 = false;
    }
    else {
      STLStringResizeUninitialized(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      string_as_array(in_RDI);
      local_1 = RawUncompress((char *)in_RDI,in_RSI,in_RDX);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Uncompress(const char* compressed, size_t compressed_length,
                std::string* uncompressed) {
  size_t ulength;
  if (!GetUncompressedLength(compressed, compressed_length, &ulength)) {
    return false;
  }
  // On 32-bit builds: max_size() < kuint32max.  Check for that instead
  // of crashing (e.g., consider externally specified compressed data).
  if (ulength > uncompressed->max_size()) {
    return false;
  }
  STLStringResizeUninitialized(uncompressed, ulength);
  return RawUncompress(compressed, compressed_length,
                       string_as_array(uncompressed));
}